

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-order.c
# Opt level: O2

int run_test_close_order(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_20;
  
  puVar2 = uv_default_loop();
  uv_check_init(puVar2,&check_handle);
  uv_check_start(&check_handle,check_cb);
  uv_timer_init(puVar2,&timer_handle1);
  uv_timer_start(&timer_handle1,timer_cb,0,0);
  uv_timer_init(puVar2,&timer_handle2);
  uv_timer_start(&timer_handle2,timer_cb,100000,0);
  if (check_cb_called == 0) {
    if (close_cb_called == 0) {
      if (timer_cb_called == 0) {
        uv_run(puVar2,UV_RUN_DEFAULT);
        if (check_cb_called == 1) {
          if (close_cb_called == 3) {
            if (timer_cb_called == 1) {
              puVar2 = uv_default_loop();
              uv_walk(puVar2,close_walk_cb,(void *)0x0);
              uv_run(puVar2,UV_RUN_DEFAULT);
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar3 = "0 == uv_loop_close(uv_default_loop())";
              uStack_20 = 0x4e;
            }
            else {
              pcVar3 = "timer_cb_called == 1";
              uStack_20 = 0x4c;
            }
          }
          else {
            pcVar3 = "close_cb_called == 3";
            uStack_20 = 0x4b;
          }
        }
        else {
          pcVar3 = "check_cb_called == 1";
          uStack_20 = 0x4a;
        }
      }
      else {
        pcVar3 = "timer_cb_called == 0";
        uStack_20 = 0x46;
      }
    }
    else {
      pcVar3 = "close_cb_called == 0";
      uStack_20 = 0x45;
    }
  }
  else {
    pcVar3 = "check_cb_called == 0";
    uStack_20 = 0x44;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-close-order.c"
          ,uStack_20,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(close_order) {
  uv_loop_t* loop;
  loop = uv_default_loop();

  uv_check_init(loop, &check_handle);
  uv_check_start(&check_handle, check_cb);
  uv_timer_init(loop, &timer_handle1);
  uv_timer_start(&timer_handle1, timer_cb, 0, 0);
  uv_timer_init(loop, &timer_handle2);
  uv_timer_start(&timer_handle2, timer_cb, 100000, 0);

  ASSERT(check_cb_called == 0);
  ASSERT(close_cb_called == 0);
  ASSERT(timer_cb_called == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(check_cb_called == 1);
  ASSERT(close_cb_called == 3);
  ASSERT(timer_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}